

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O2

void Lpk_ComputeSupports(Lpk_Man_t *p,Lpk_Cut_t *pCut,uint *pTruth)

{
  int iVar1;
  int iVar2;
  uint *pTruth_00;
  
  pTruth_00 = Lpk_CutTruth(p,pCut,1);
  iVar1 = Kit_CreateCloudFromTruth(p->pDsdMan->dd,pTruth,*(uint *)pCut & 0x3f,p->vBddDir);
  iVar2 = Kit_CreateCloudFromTruth(p->pDsdMan->dd,pTruth_00,*(uint *)pCut & 0x3f,p->vBddInv);
  if ((((iVar1 != 0) && (iVar2 != 0)) && (1 < p->vBddDir->nSize)) && (1 < p->vBddInv->nSize)) {
    Kit_TruthCofSupports(p->vBddDir,p->vBddInv,*(uint *)pCut & 0x3f,p->vMemory,p->puSupps);
    return;
  }
  p->puSupps[0] = 0;
  p->puSupps[1] = 0;
  return;
}

Assistant:

void Lpk_ComputeSupports( Lpk_Man_t * p, Lpk_Cut_t * pCut, unsigned * pTruth )
{
    unsigned * pTruthInv;
    int RetValue1, RetValue2;
    pTruthInv = Lpk_CutTruth( p, pCut, 1 );
    RetValue1 = Kit_CreateCloudFromTruth( p->pDsdMan->dd, pTruth, pCut->nLeaves, p->vBddDir );
    RetValue2 = Kit_CreateCloudFromTruth( p->pDsdMan->dd, pTruthInv, pCut->nLeaves, p->vBddInv );
    if ( RetValue1 && RetValue2 && Vec_IntSize(p->vBddDir) > 1 && Vec_IntSize(p->vBddInv) > 1 )
        Kit_TruthCofSupports( p->vBddDir, p->vBddInv, pCut->nLeaves, p->vMemory, p->puSupps ); 
    else
        p->puSupps[0] = p->puSupps[1] = 0;
}